

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableUpdateBorders(ImGuiTable *table)

{
  char cVar1;
  ImGuiTableColumn *pIVar2;
  bool bVar3;
  int iVar4;
  ImGuiTableInstanceData *pIVar5;
  ImGuiID id;
  ulong uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  bool hovered;
  bool held;
  ImRect hit_rect;
  bool local_6a;
  bool local_69;
  float local_68;
  float local_64;
  ImRect local_60;
  ImGuiContext *local_50;
  undefined1 local_48 [16];
  
  if ((long)table->InstanceCurrent == 0) {
    pIVar5 = &table->InstanceDataFirst;
  }
  else {
    pIVar5 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
  }
  iVar4 = table->ColumnsCount;
  if (0 < iVar4) {
    local_50 = GImGui;
    local_64 = (table->OuterRect).Min.y;
    fVar8 = (table->OuterRect).Max.y;
    fVar9 = pIVar5->LastOuterHeight + local_64;
    uVar7 = -(uint)(fVar9 <= fVar8);
    local_48 = ZEXT416(uVar7 & (uint)fVar8 | ~uVar7 & (uint)fVar9);
    local_68 = pIVar5->LastFirstRowHeight + local_64;
    uVar6 = 0;
    do {
      if ((table->EnabledMaskByDisplayOrder >> (uVar6 & 0x3f) & 1) != 0) {
        pIVar2 = (table->Columns).Data;
        cVar1 = (table->DisplayOrderToIndex).Data[uVar6];
        if ((pIVar2[cVar1].Flags & 0x40000020U) == 0) {
          local_60.Max.y = (float)local_48._0_4_;
          if ((((table->Flags & 0x800) == 0) ||
              (local_60.Max.y = local_68, table->IsUsingHeaders != false)) &&
             ((pIVar2[cVar1].IsVisibleX != false || (table->LastResizedColumn == cVar1)))) {
            id = iVar4 * table->InstanceCurrent + (int)cVar1 + table->ID + 1;
            local_60.Min.x = pIVar2[cVar1].MaxX + -4.0;
            local_60.Max.x = pIVar2[cVar1].MaxX + 4.0;
            local_60.Min.y = local_64;
            ItemAdd(&local_60,id,(ImRect *)0x0,8);
            local_6a = false;
            local_69 = false;
            bVar3 = ButtonBehavior(&local_60,id,&local_6a,&local_69,0x41910);
            if ((bVar3) && (bVar3 = IsMouseDoubleClicked(0), bVar3)) {
              pIVar2 = (table->Columns).Data;
              if (pIVar2[cVar1].IsEnabled == true) {
                pIVar2[cVar1].CannotSkipItemsQueue = '\x01';
                table->AutoFitSingleColumn = cVar1;
              }
              ClearActiveID();
              local_6a = false;
              local_69 = false;
            }
            if (local_69 == true) {
              if (table->LastResizedColumn == -1) {
                fVar8 = -3.4028235e+38;
                if ((long)table->RightMostEnabledColumn != -1) {
                  fVar8 = (table->Columns).Data[table->RightMostEnabledColumn].MaxX;
                }
                table->ResizeLockMinContentsX2 = fVar8;
              }
              table->ResizedColumn = cVar1;
              table->InstanceInteracted = table->InstanceCurrent;
              if (local_6a != false) {
LAB_0022e020:
                if (local_50->HoveredIdTimer <= 0.06 && local_69 == false) goto LAB_0022e04c;
              }
              table->HoveredColumnBorder = cVar1;
              SetMouseCursor(4);
            }
            else if (local_6a == true) goto LAB_0022e020;
LAB_0022e04c:
            iVar4 = table->ColumnsCount;
          }
        }
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)iVar4);
  }
  return;
}

Assistant:

void ImGui::TableUpdateBorders(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Resizable);

    // At this point OuterRect height may be zero or under actual final height, so we rely on temporal coherency and
    // use the final height from last frame. Because this is only affecting _interaction_ with columns, it is not
    // really problematic (whereas the actual visual will be displayed in EndTable() and using the current frame height).
    // Actual columns highlight/render will be performed in EndTable() and not be affected.
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    const float hit_half_width = TABLE_RESIZE_SEPARATOR_HALF_THICKNESS;
    const float hit_y1 = table->OuterRect.Min.y;
    const float hit_y2_body = ImMax(table->OuterRect.Max.y, hit_y1 + table_instance->LastOuterHeight);
    const float hit_y2_head = hit_y1 + table_instance->LastFirstRowHeight;

    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;

        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_))
            continue;

        // ImGuiTableFlags_NoBordersInBodyUntilResize will be honored in TableDrawBorders()
        const float border_y2_hit = (table->Flags & ImGuiTableFlags_NoBordersInBody) ? hit_y2_head : hit_y2_body;
        if ((table->Flags & ImGuiTableFlags_NoBordersInBody) && table->IsUsingHeaders == false)
            continue;

        if (!column->IsVisibleX && table->LastResizedColumn != column_n)
            continue;

        ImGuiID column_id = TableGetColumnResizeID(table, column_n, table->InstanceCurrent);
        ImRect hit_rect(column->MaxX - hit_half_width, hit_y1, column->MaxX + hit_half_width, border_y2_hit);
        ItemAdd(hit_rect, column_id, NULL, ImGuiItemFlags_NoNav);
        //GetForegroundDrawList()->AddRect(hit_rect.Min, hit_rect.Max, IM_COL32(255, 0, 0, 100));

        bool hovered = false, held = false;
        bool pressed = ButtonBehavior(hit_rect, column_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnDoubleClick | ImGuiButtonFlags_NoNavFocus);
        if (pressed && IsMouseDoubleClicked(0))
        {
            TableSetColumnWidthAutoSingle(table, column_n);
            ClearActiveID();
            held = hovered = false;
        }
        if (held)
        {
            if (table->LastResizedColumn == -1)
                table->ResizeLockMinContentsX2 = table->RightMostEnabledColumn != -1 ? table->Columns[table->RightMostEnabledColumn].MaxX : -FLT_MAX;
            table->ResizedColumn = (ImGuiTableColumnIdx)column_n;
            table->InstanceInteracted = table->InstanceCurrent;
        }
        if ((hovered && g.HoveredIdTimer > TABLE_RESIZE_SEPARATOR_FEEDBACK_TIMER) || held)
        {
            table->HoveredColumnBorder = (ImGuiTableColumnIdx)column_n;
            SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        }
    }
}